

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O3

string_view __thiscall
slang::SourceManager::getMacroName(SourceManager *this,SourceLocation location)

{
  pointer pvVar1;
  ulong uVar2;
  variant_alternative_t<1UL,_variant<FileInfo,_ExpansionInfo>_> *pvVar3;
  pointer pvVar4;
  char *pcVar5;
  size_t sVar6;
  string_view sVar7;
  
  std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
  uVar2 = (ulong)location & 0xfffffff;
  if ((uVar2 != 0) && (location != (SourceLocation)0xffffffffffffffff)) {
    pvVar4 = (this->bufferEntries).
             super__Vector_base<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((pvVar4 != (pointer)0x0) &&
       (*(__index_type *)
         ((long)&pvVar4[uVar2].
                 super__Variant_base<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                 .
                 super__Move_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                 .
                 super__Copy_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
         + 0x38) == '\x01')) {
      pvVar4 = pvVar4 + uVar2;
      while (*(char *)((long)&(pvVar4->
                              super__Variant_base<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                              ).
                              super__Move_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                              .
                              super__Copy_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                              .
                              super__Move_ctor_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                              .
                              super__Copy_ctor_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                              .
                              super__Variant_storage_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                              ._M_u + 0x18) == '\x01') {
        pvVar3 = std::get<1ul,slang::SourceManager::FileInfo,slang::SourceManager::ExpansionInfo>
                           (pvVar4);
        location = (pvVar3->expansionRange).startLoc;
        uVar2 = (ulong)location & 0xfffffff;
        if ((((uVar2 == 0) || (location == (SourceLocation)0xffffffffffffffff)) ||
            (pvVar1 = (this->bufferEntries).
                      super__Vector_base<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
                      ._M_impl.super__Vector_impl_data._M_start, pvVar1 == (pointer)0x0)) ||
           (pvVar4 = pvVar1 + uVar2,
           *(__index_type *)
            ((long)&pvVar1[uVar2].
                    super__Variant_base<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                    .
                    super__Move_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                    .
                    super__Copy_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
            + 0x38) != '\x01')) break;
      }
    }
    uVar2 = (ulong)(location._0_4_ & 0xfffffff);
  }
  if (uVar2 != 0) {
    pvVar4 = (this->bufferEntries).
             super__Vector_base<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar5 = (char *)0x0;
    if (pvVar4 != (pointer)0x0) {
      sVar6 = 0;
      if (*(__index_type *)
           ((long)&pvVar4[uVar2].
                   super__Variant_base<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                   .
                   super__Move_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                   .
                   super__Copy_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
           + 0x38) == '\x01') {
        sVar6 = *(size_t *)
                 ((long)&pvVar4[uVar2].
                         super__Variant_base<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                         .
                         super__Move_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                         .
                         super__Copy_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                 + 0x20);
        pcVar5 = *(char **)((long)&pvVar4[uVar2].
                                   super__Variant_base<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                                   .
                                   super__Move_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                                   .
                                   super__Copy_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                           + 0x28);
      }
      goto LAB_002207dc;
    }
  }
  pcVar5 = (char *)0x0;
  sVar6 = 0;
LAB_002207dc:
  pthread_rwlock_unlock((pthread_rwlock_t *)this);
  sVar7._M_str = pcVar5;
  sVar7._M_len = sVar6;
  return sVar7;
}

Assistant:

std::string_view SourceManager::getMacroName(SourceLocation location) const {
    std::shared_lock<std::shared_mutex> lock(mutex);
    while (isMacroArgLocImpl(location, lock))
        location = getExpansionRangeImpl(location, lock).start();

    auto buffer = location.buffer();
    if (!buffer)
        return {};

    SLANG_ASSERT(buffer.getId() < bufferEntries.size());
    auto info = std::get_if<ExpansionInfo>(&bufferEntries[buffer.getId()]);
    if (!info)
        return {};

    return info->macroName;
}